

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_field.cc
# Opt level: O2

void google::protobuf::compiler::javanano::SetCommonOneofVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  mapped_type *pmVar1;
  long lVar2;
  int i;
  int i_00;
  OneofDescriptor *in_RDX;
  OneofDescriptor *oneof;
  allocator<char> local_da;
  allocator<char> local_d9;
  key_type local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  key_type local_78;
  key_type local_58;
  string local_38;
  
  UnderscoresToCamelCase_abi_cxx11_(&local_b8,*(javanano **)(descriptor + 0x60),in_RDX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"oneof_name",(allocator<char> *)&local_98);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_d8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  UnderscoresToCapitalizedCamelCase_abi_cxx11_(&local_b8,*(javanano **)(descriptor + 0x60),oneof);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"oneof_capitalized_name",(allocator<char> *)&local_98);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_d8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  lVar2 = *(long *)(descriptor + 0x60) -
          *(long *)(*(long *)(*(long *)(descriptor + 0x60) + 0x10) + 0x40);
  SimpleItoa_abi_cxx11_(&local_b8,(protobuf *)(lVar2 / 0x30 & 0xffffffff),(int)(lVar2 % 0x30));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"oneof_index",(allocator<char> *)&local_98);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_d8);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"oneof_name",&local_d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::operator+(&local_98,"this.",pmVar1);
  std::operator+(&local_d8,&local_98,"Case_ = ");
  SimpleItoa_abi_cxx11_(&local_38,(protobuf *)(ulong)*(uint *)(descriptor + 0x38),i);
  std::operator+(&local_b8,&local_d8,&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"set_oneof_case",&local_da)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_58);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"oneof_name",(allocator<char> *)&local_38);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_98);
  std::operator+(&local_d8,"this.",pmVar1);
  std::operator+(&local_b8,&local_d8,"Case_ = 0");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"clear_oneof_case",(allocator<char> *)&local_58);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"oneof_name",&local_d9);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_78);
  std::operator+(&local_98,"this.",pmVar1);
  std::operator+(&local_d8,&local_98,"Case_ == ");
  SimpleItoa_abi_cxx11_(&local_38,(protobuf *)(ulong)*(uint *)(descriptor + 0x38),i_00);
  std::operator+(&local_b8,&local_d8,&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"has_oneof_case",&local_da)
  ;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_58);
  std::__cxx11::string::operator=((string *)pmVar1,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void SetCommonOneofVariables(const FieldDescriptor* descriptor,
                             map<string, string>* variables) {
  (*variables)["oneof_name"] =
      UnderscoresToCamelCase(descriptor->containing_oneof());
  (*variables)["oneof_capitalized_name"] =
      UnderscoresToCapitalizedCamelCase(descriptor->containing_oneof());
  (*variables)["oneof_index"] =
      SimpleItoa(descriptor->containing_oneof()->index());
  (*variables)["set_oneof_case"] =
      "this." + (*variables)["oneof_name"] +
      "Case_ = " + SimpleItoa(descriptor->number());
  (*variables)["clear_oneof_case"] =
      "this." + (*variables)["oneof_name"] + "Case_ = 0";
  (*variables)["has_oneof_case"] =
      "this." + (*variables)["oneof_name"] + "Case_ == " +
      SimpleItoa(descriptor->number());
}